

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O1

edata_t * duckdb_je_edata_avail_first(edata_avail_t *ph)

{
  void *pvVar1;
  long lVar2;
  uintptr_t a_eaddr;
  ulong uVar3;
  uintptr_t a_eaddr_1;
  ulong uVar4;
  uintptr_t b_eaddr;
  ulong uVar5;
  ulong uVar6;
  uintptr_t b_eaddr_2;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  pvVar1 = (ph->ph).root;
  if (pvVar1 == (void *)0x0) {
    return (edata_t *)0x0;
  }
  (ph->ph).auxcount = 0;
  uVar3 = *(ulong *)((long)pvVar1 + 0x30);
  if (uVar3 != 0) {
    *(undefined8 *)((long)pvVar1 + 0x28) = 0;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    *(undefined8 *)(uVar3 + 0x28) = 0;
    uVar5 = *(ulong *)(uVar3 + 0x30);
    if (uVar5 != 0) {
      uVar8 = *(ulong *)(uVar5 + 0x30);
      if (uVar8 != 0) {
        *(undefined8 *)(uVar8 + 0x28) = 0;
      }
      *(undefined8 *)(uVar3 + 0x28) = 0;
      *(undefined8 *)(uVar3 + 0x30) = 0;
      *(undefined8 *)(uVar5 + 0x28) = 0;
      *(undefined8 *)(uVar5 + 0x30) = 0;
      uVar7 = *(ulong *)(uVar3 + 0x10) & 0xfff;
      uVar6 = *(ulong *)(uVar5 + 0x10) & 0xfff;
      if ((int)(((uint)(uVar6 < uVar7) - (uint)(uVar7 < uVar6)) * 2 - (uint)(uVar3 < uVar5)) < 0) {
        *(ulong *)(uVar5 + 0x28) = uVar3;
        lVar2 = *(long *)(uVar3 + 0x38);
        *(long *)(uVar5 + 0x30) = lVar2;
        if (lVar2 != 0) {
          *(ulong *)(lVar2 + 0x28) = uVar5;
        }
        *(ulong *)(uVar3 + 0x38) = uVar5;
        uVar5 = uVar3;
      }
      else {
        *(ulong *)(uVar3 + 0x28) = uVar5;
        lVar2 = *(long *)(uVar5 + 0x38);
        *(long *)(uVar3 + 0x30) = lVar2;
        if (lVar2 != 0) {
          *(ulong *)(lVar2 + 0x28) = uVar3;
        }
        *(ulong *)(uVar5 + 0x38) = uVar3;
        uVar3 = uVar5;
      }
      while (uVar6 = uVar8, uVar6 != 0) {
        uVar7 = *(ulong *)(uVar6 + 0x30);
        if (uVar7 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = *(ulong *)(uVar7 + 0x30);
          if (uVar8 != 0) {
            *(undefined8 *)(uVar8 + 0x28) = 0;
          }
          *(undefined8 *)(uVar6 + 0x28) = 0;
          *(undefined8 *)(uVar6 + 0x30) = 0;
          *(undefined8 *)(uVar7 + 0x28) = 0;
          *(undefined8 *)(uVar7 + 0x30) = 0;
          uVar9 = *(ulong *)(uVar6 + 0x10) & 0xfff;
          uVar4 = *(ulong *)(uVar7 + 0x10) & 0xfff;
          if ((int)(((uint)(uVar4 < uVar9) - (uint)(uVar9 < uVar4)) * 2 - (uint)(uVar6 < uVar7)) < 0
             ) {
            *(ulong *)(uVar7 + 0x28) = uVar6;
            lVar2 = *(long *)(uVar6 + 0x38);
            *(long *)(uVar7 + 0x30) = lVar2;
            if (lVar2 != 0) {
              *(ulong *)(lVar2 + 0x28) = uVar7;
            }
            *(ulong *)(uVar6 + 0x38) = uVar7;
          }
          else {
            *(ulong *)(uVar6 + 0x28) = uVar7;
            lVar2 = *(long *)(uVar7 + 0x38);
            *(long *)(uVar6 + 0x30) = lVar2;
            if (lVar2 != 0) {
              *(ulong *)(lVar2 + 0x28) = uVar6;
            }
            *(ulong *)(uVar7 + 0x38) = uVar6;
            uVar6 = uVar7;
          }
        }
        *(ulong *)(uVar5 + 0x30) = uVar6;
        uVar5 = uVar6;
      }
      uVar6 = *(ulong *)(uVar3 + 0x30);
      uVar8 = uVar3;
      if (uVar6 != 0) {
        while( true ) {
          uVar3 = uVar8;
          uVar8 = *(ulong *)(uVar6 + 0x30);
          *(undefined8 *)(uVar3 + 0x30) = 0;
          *(undefined8 *)(uVar6 + 0x30) = 0;
          if (uVar6 != 0) {
            uVar4 = *(ulong *)(uVar3 + 0x10) & 0xfff;
            uVar7 = *(ulong *)(uVar6 + 0x10) & 0xfff;
            if ((int)(((uint)(uVar7 < uVar4) - (uint)(uVar4 < uVar7)) * 2 - (uint)(uVar3 < uVar6)) <
                0) {
              *(ulong *)(uVar6 + 0x28) = uVar3;
              lVar2 = *(long *)(uVar3 + 0x38);
              *(long *)(uVar6 + 0x30) = lVar2;
              if (lVar2 != 0) {
                *(ulong *)(lVar2 + 0x28) = uVar6;
              }
              *(ulong *)(uVar3 + 0x38) = uVar6;
            }
            else {
              *(ulong *)(uVar3 + 0x28) = uVar6;
              lVar2 = *(long *)(uVar6 + 0x38);
              *(long *)(uVar3 + 0x30) = lVar2;
              if (lVar2 != 0) {
                *(ulong *)(lVar2 + 0x28) = uVar3;
              }
              *(ulong *)(uVar6 + 0x38) = uVar3;
              uVar3 = uVar6;
            }
          }
          if (uVar8 == 0) break;
          *(ulong *)(uVar5 + 0x30) = uVar3;
          uVar6 = *(ulong *)(uVar8 + 0x30);
          uVar5 = uVar3;
        }
      }
    }
    *(void **)(uVar3 + 0x28) = pvVar1;
    lVar2 = *(long *)((long)pvVar1 + 0x38);
    *(long *)(uVar3 + 0x30) = lVar2;
    if (lVar2 != 0) {
      *(ulong *)(lVar2 + 0x28) = uVar3;
    }
    *(ulong *)((long)pvVar1 + 0x38) = uVar3;
  }
  return (edata_t *)(ph->ph).root;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_first(ph_t *ph, size_t offset, ph_cmp_t cmp) {
	if (ph->root == NULL) {
		return NULL;
	}
	ph_merge_aux(ph, offset, cmp);
	return ph->root;
}